

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void problem_clear(CUPDLPproblem *problem)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      data_clear((CUPDLPdata *)problem);
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    if (in_RDI[2] != 0) {
      free((void *)in_RDI[2]);
      in_RDI[2] = 0;
    }
    if (in_RDI[3] != 0) {
      free((void *)in_RDI[3]);
      in_RDI[3] = 0;
    }
    if (in_RDI[4] != 0) {
      free((void *)in_RDI[4]);
      in_RDI[4] = 0;
    }
    if (in_RDI[10] != 0) {
      free((void *)in_RDI[10]);
      in_RDI[10] = 0;
    }
    if (in_RDI[0xb] != 0) {
      free((void *)in_RDI[0xb]);
      in_RDI[0xb] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void problem_clear(CUPDLPproblem *problem) {
  if (problem) {
    if (problem->data) {
      data_clear(problem->data);
    }
    //        if (problem->colMatBeg) {
    //            cupdlp_free(problem->colMatBeg);
    //        }
    //        if (problem->colMatIdx) {
    //            cupdlp_free(problem->colMatIdx);
    //        }
    //        if (problem->colMatElem) {
    //            cupdlp_free(problem->colMatElem);
    //        }
    //        if (problem->rowMatBeg) {
    //            cupdlp_free(problem->rowMatBeg);
    //        }
    //        if (problem->rowMatIdx) {
    //            cupdlp_free(problem->rowMatIdx);
    //        }
    //        if (problem->rowMatElem) {
    //            cupdlp_free(problem->rowMatElem);
    //        }
    if (problem->lower) {
      CUPDLP_FREE_VEC(problem->lower);
    }
    if (problem->upper) {
      CUPDLP_FREE_VEC(problem->upper);
    }
    if (problem->cost) {
      CUPDLP_FREE_VEC(problem->cost);
    }
    if (problem->rhs) {
      CUPDLP_FREE_VEC(problem->rhs);
    }
    if (problem->hasLower) {
      CUPDLP_FREE_VEC(problem->hasLower);
    }
    if (problem->hasUpper) {
      CUPDLP_FREE_VEC(problem->hasUpper);
    }
    cupdlp_free(problem);
  }
}